

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_parse_ip.c
# Opt level: O3

_Bool x11_parse_ip(char *addr_string,unsigned_long *ip)

{
  int iVar1;
  _Bool _Var2;
  int i [4];
  int local_28;
  int local_24;
  int local_20;
  uint local_1c [3];
  
  if (addr_string == (char *)0x0) {
    _Var2 = false;
  }
  else {
    _Var2 = false;
    iVar1 = __isoc99_sscanf(addr_string,"%d.%d.%d.%d",&local_28,&local_24,&local_20,local_1c);
    if (iVar1 == 4) {
      *ip = (long)(int)(local_20 << 8 | local_24 << 0x10 | local_28 << 0x18 | local_1c[0]);
      _Var2 = true;
    }
  }
  return _Var2;
}

Assistant:

bool x11_parse_ip(const char *addr_string, unsigned long *ip)
{
    int i[4];
    if (addr_string &&
        4 == sscanf(addr_string, "%d.%d.%d.%d", i+0, i+1, i+2, i+3)) {
        *ip = (i[0] << 24) | (i[1] << 16) | (i[2] << 8) | i[3];
        return true;
    } else {
        return false;
    }
}